

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void pq_base_push_front(PacketQueueBase *pqb,PacketQueueNode *node)

{
  PacketQueueNode *pPVar1;
  
  pq_ensure_unlinked(node);
  node->prev = &pqb->end;
  pPVar1 = (pqb->end).next;
  node->next = pPVar1;
  pPVar1->prev = node;
  node->prev->next = node;
  pqb->total_size = pqb->total_size + node->formal_size;
  if (pqb->ic != (IdempotentCallback *)0x0) {
    queue_idempotent_callback(pqb->ic);
    return;
  }
  return;
}

Assistant:

void pq_base_push_front(PacketQueueBase *pqb, PacketQueueNode *node)
{
    pq_ensure_unlinked(node);
    node->prev = &pqb->end;
    node->next = pqb->end.next;
    node->next->prev = node;
    node->prev->next = node;
    pqb->total_size += node->formal_size;

    if (pqb->ic)
        queue_idempotent_callback(pqb->ic);
}